

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DeferredTypeHandlerBase::ConvertFunction
          (DeferredTypeHandlerBase *this,JavascriptFunction *instance,
          DynamicTypeHandler *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  int iVar7;
  DynamicType *pDVar8;
  DynamicTypeHandler *pDVar9;
  undefined4 *puVar10;
  Type *pTVar11;
  JavascriptMethod thunk;
  ScriptContext *scriptContext_00;
  FunctionProxy *this_00;
  RecyclableObject *pRVar12;
  RecyclableObject *pRVar13;
  ScriptFunction *this_01;
  ScriptFunctionType *type;
  ParseableFunctionInfo *pPVar14;
  ScriptFunctionType *pSVar15;
  JavascriptLibrary *this_02;
  ScriptFunctionType *local_78;
  int local_58;
  BigPropertyIndex i;
  BigPropertyIndex propertyCount;
  Var undefined;
  ScriptFunctionType *newType;
  ScriptFunctionType *undeferredFunctionType;
  FunctionProxy *functionProxy;
  ScriptContext *scriptContext;
  bool isCrossSite;
  bool isProto;
  DynamicTypeHandler *typeHandler_local;
  JavascriptFunction *instance_local;
  DeferredTypeHandlerBase *this_local;
  
  pDVar8 = DynamicObject::GetDynamicType(&instance->super_DynamicObject);
  pDVar9 = DynamicType::GetTypeHandler(pDVar8);
  if (pDVar9 != &this->super_DynamicTypeHandler) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xd,"(instance->GetDynamicType()->GetTypeHandler() == this)",
                                "instance->GetDynamicType()->GetTypeHandler() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((this->super_DynamicTypeHandler).inlineSlotCapacity != typeHandler->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xe,"(this->inlineSlotCapacity == typeHandler->inlineSlotCapacity)"
                                ,"this->inlineSlotCapacity == typeHandler->inlineSlotCapacity");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((this->super_DynamicTypeHandler).offsetOfInlineSlots != typeHandler->offsetOfInlineSlots) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xf,
                                "(this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots)",
                                "this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(typeHandler);
  if (bVar2 != bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x10,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar2 = DynamicTypeHandler::GetIsPrototype(&this->super_DynamicTypeHandler);
  pTVar11 = RecyclableObject::GetType((RecyclableObject *)instance);
  thunk = Js::Type::GetEntryPoint(pTVar11);
  bVar3 = CrossSite::IsThunk(thunk);
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)instance);
  iVar5 = DynamicTypeHandler::GetSlotCapacity(typeHandler);
  DynamicObject::EnsureSlots(&instance->super_DynamicObject,0,iVar5,scriptContext_00,typeHandler);
  this_00 = JavascriptFunction::GetFunctionProxy(instance);
  newType = (ScriptFunctionType *)0x0;
  if (this_00 != (FunctionProxy *)0x0) {
    if (bVar3) {
      local_78 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
    }
    else {
      local_78 = FunctionProxy::GetUndeferredFunctionType(this_00);
    }
    newType = local_78;
  }
  if ((newType != (ScriptFunctionType *)0x0) && (!bVar2)) {
    pRVar12 = Js::Type::GetPrototype((Type *)newType);
    pTVar11 = RecyclableObject::GetType((RecyclableObject *)instance);
    pRVar13 = Js::Type::GetPrototype(pTVar11);
    if (pRVar12 == pRVar13) {
      bVar3 = DynamicType::GetIsShared(&newType->super_DynamicType);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                    ,0x27,"(undeferredFunctionType->GetIsShared())",
                                    "undeferredFunctionType->GetIsShared()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      DynamicObject::ReplaceType(&instance->super_DynamicObject,&newType->super_DynamicType);
      goto LAB_013dcddf;
    }
  }
  DynamicTypeHandler::SetInstanceTypeHandler(typeHandler,&instance->super_DynamicObject,true);
  if ((((this_00 != (FunctionProxy *)0x0) && (!bVar2)) &&
      (bVar4 = DynamicTypeHandler::GetMayBecomeShared(typeHandler), bVar4)) &&
     (bVar4 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareFuncTypesPhase), !bVar4)) {
    this_01 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(instance);
    type = ScriptFunction::GetScriptFunctionType(this_01);
    if (bVar3) {
      BVar6 = FunctionProxy::HasParseableInfo(this_00);
      if (BVar6 != 0) {
        pPVar14 = FunctionProxy::GetParseableFunctionInfo(this_00);
        pSVar15 = ParseableFunctionInfo::GetCrossSiteUndeferredFunctionType(pPVar14);
        if (pSVar15 == (ScriptFunctionType *)0x0) {
          pPVar14 = FunctionProxy::GetParseableFunctionInfo(this_00);
          ParseableFunctionInfo::SetCrossSiteUndeferredFunctionType(pPVar14,type);
        }
      }
    }
    else {
      pSVar15 = FunctionProxy::GetUndeferredFunctionType(this_00);
      if (pSVar15 == (ScriptFunctionType *)0x0) {
        FunctionProxy::SetUndeferredFunctionType(this_00,type);
      }
    }
    DynamicObject::ShareType(&instance->super_DynamicObject);
  }
LAB_013dcddf:
  this_02 = ScriptContext::GetLibrary(scriptContext_00);
  pRVar12 = JavascriptLibraryBase::GetUndefined(&this_02->super_JavascriptLibraryBase);
  iVar5 = (*typeHandler->_vptr_DynamicTypeHandler[6])();
  iVar7 = DynamicTypeHandler::GetSlotCapacity(typeHandler);
  if (iVar7 < iVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x42,"(propertyCount <= typeHandler->GetSlotCapacity())",
                                "propertyCount <= typeHandler->GetSlotCapacity()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  for (local_58 = 0; local_58 < iVar5; local_58 = local_58 + 1) {
    DynamicTypeHandler::SetSlotUnchecked(&instance->super_DynamicObject,local_58,pRVar12);
  }
  if (bVar2) {
    pDVar8 = DynamicObject::GetDynamicType(&instance->super_DynamicObject);
    pDVar9 = DynamicType::GetTypeHandler(pDVar8);
    (*pDVar9->_vptr_DynamicTypeHandler[0x52])(pDVar9,instance);
  }
  return;
}

Assistant:

void DeferredTypeHandlerBase::ConvertFunction(JavascriptFunction * instance, DynamicTypeHandler * typeHandler)
    {
        Assert(instance->GetDynamicType()->GetTypeHandler() == this);
        Assert(this->inlineSlotCapacity == typeHandler->inlineSlotCapacity);
        Assert(this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots);
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());

        // Since the caller owns the typeHandler the instance is transitioning to, the caller should have
        // set up the singleton instance on that handler, if fixed fields are desired.  The caller is
        // also responsible for populating PropertyTypes to indicate whether there are any read-only
        // properties unknown to the type handler.

        bool isProto = this->GetIsPrototype();
        bool isCrossSite = CrossSite::IsThunk(instance->GetType()->GetEntryPoint()); 

        ScriptContext* scriptContext = instance->GetScriptContext();
        instance->EnsureSlots(0, typeHandler->GetSlotCapacity(), scriptContext, typeHandler);

        FunctionProxy * functionProxy = instance->GetFunctionProxy();

        ScriptFunctionType * undeferredFunctionType = nullptr;
        if (functionProxy)
        {
            undeferredFunctionType = isCrossSite ? functionProxy->GetCrossSiteUndeferredFunctionType() : functionProxy->GetUndeferredFunctionType();
        }

        if (undeferredFunctionType && !isProto && (undeferredFunctionType->GetPrototype() == instance->GetType()->GetPrototype()))
        {
            Assert(undeferredFunctionType->GetIsShared());
            instance->ReplaceType(undeferredFunctionType);
        }
        else
        {
            typeHandler->SetInstanceTypeHandler(instance);
            if (functionProxy && !isProto && typeHandler->GetMayBecomeShared() && !PHASE_OFF1(ShareFuncTypesPhase))
            {
                ScriptFunctionType *newType = UnsafeVarTo<ScriptFunction>(instance)->GetScriptFunctionType();
                if (isCrossSite)
                {
                    if (functionProxy->HasParseableInfo() && !functionProxy->GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType())
                    {
                        functionProxy->GetParseableFunctionInfo()->SetCrossSiteUndeferredFunctionType(newType);
                    }
                }
                else if (!functionProxy->GetUndeferredFunctionType())
                {
                    functionProxy->SetUndeferredFunctionType(newType);
                }
                instance->ShareType();
            }
        }

        // We may be changing to a type handler that already has some properties. Initialize those to undefined.
        const Var undefined = scriptContext->GetLibrary()->GetUndefined();
        const BigPropertyIndex propertyCount = typeHandler->GetPropertyCount();
        Assert(propertyCount <= typeHandler->GetSlotCapacity());
        for(BigPropertyIndex i = 0; i < propertyCount; ++i)
        {
            typeHandler->SetSlotUnchecked(instance, i, undefined);
        }

        if (isProto)
        {
            instance->GetDynamicType()->GetTypeHandler()->SetIsPrototype(instance);
        }
    }